

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numpy.h
# Opt level: O0

void __thiscall pybind11::array::array<int>(array *this,ssize_t count,int *ptr,handle base)

{
  any_container<long> local_78;
  ssize_t local_58;
  initializer_list<long> local_50;
  any_container<long> local_40;
  int *local_28;
  int *ptr_local;
  ssize_t count_local;
  array *this_local;
  handle base_local;
  
  local_50._M_array = &local_58;
  local_50._M_len = 1;
  local_58 = count;
  local_28 = ptr;
  ptr_local = (int *)count;
  count_local = (ssize_t)this;
  this_local = (array *)base.m_ptr;
  detail::any_container<long>::any_container<long,void>(&local_40,&local_50);
  local_78.v.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_78.v.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_78.v.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  detail::any_container<long>::any_container(&local_78);
  array<int>(this,&local_40,&local_78,local_28,(handle)this_local);
  detail::any_container<long>::~any_container(&local_78);
  detail::any_container<long>::~any_container(&local_40);
  return;
}

Assistant:

explicit array(ssize_t count, const T *ptr, handle base = handle())
        : array({count}, {}, ptr, base) {}